

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InlinePass::GetFalseId(InlinePass *this)

{
  uint32_t uVar1;
  Module *pMVar2;
  IRContext *pIVar3;
  uint32_t local_1c;
  uint32_t boolId;
  InlinePass *this_local;
  
  if (this->false_id_ == 0) {
    pMVar2 = Pass::get_module(&this->super_Pass);
    uVar1 = Module::GetGlobalValue(pMVar2,OpConstantFalse);
    this->false_id_ = uVar1;
    if (this->false_id_ == 0) {
      pMVar2 = Pass::get_module(&this->super_Pass);
      local_1c = Module::GetGlobalValue(pMVar2,OpTypeBool);
      if (local_1c == 0) {
        pIVar3 = Pass::context(&this->super_Pass);
        local_1c = IRContext::TakeNextId(pIVar3);
        if (local_1c == 0) {
          return 0;
        }
        pMVar2 = Pass::get_module(&this->super_Pass);
        Module::AddGlobalValue(pMVar2,OpTypeBool,local_1c,0);
      }
      pIVar3 = Pass::context(&this->super_Pass);
      uVar1 = IRContext::TakeNextId(pIVar3);
      this->false_id_ = uVar1;
      if (this->false_id_ == 0) {
        this_local._4_4_ = 0;
      }
      else {
        pMVar2 = Pass::get_module(&this->super_Pass);
        Module::AddGlobalValue(pMVar2,OpConstantFalse,this->false_id_,local_1c);
        this_local._4_4_ = this->false_id_;
      }
    }
    else {
      this_local._4_4_ = this->false_id_;
    }
  }
  else {
    this_local._4_4_ = this->false_id_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InlinePass::GetFalseId() {
  if (false_id_ != 0) return false_id_;
  false_id_ = get_module()->GetGlobalValue(spv::Op::OpConstantFalse);
  if (false_id_ != 0) return false_id_;
  uint32_t boolId = get_module()->GetGlobalValue(spv::Op::OpTypeBool);
  if (boolId == 0) {
    boolId = context()->TakeNextId();
    if (boolId == 0) {
      return 0;
    }
    get_module()->AddGlobalValue(spv::Op::OpTypeBool, boolId, 0);
  }
  false_id_ = context()->TakeNextId();
  if (false_id_ == 0) {
    return 0;
  }
  get_module()->AddGlobalValue(spv::Op::OpConstantFalse, false_id_, boolId);
  return false_id_;
}